

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O2

CTypeID lj_ctype_getname(CTState *cts,CType **ctp,GCstr *name,uint32_t tmask)

{
  ushort uVar1;
  CType *pCVar2;
  uint uVar3;
  CType *pCVar4;
  uint uVar5;
  CTypeID1 *pCVar6;
  
  uVar3 = (uint)name + 0xfb3ee249;
  uVar5 = (uVar3 ^ (uint)name) - (uVar3 * 0x4000 | uVar3 >> 0x12);
  pCVar6 = cts->hash + ((uVar3 >> 0xd ^ uVar5) - (uVar5 >> 0x13) & 0x7f);
  pCVar2 = cts->tab;
  while( true ) {
    uVar1 = *pCVar6;
    uVar3 = (uint)uVar1;
    if (uVar1 == 0) break;
    pCVar4 = pCVar2 + uVar1;
    if (((GCstr *)(ulong)pCVar2[uVar1].name.gcptr32 == name) &&
       ((tmask >> (pCVar4->info >> 0x1c) & 1) != 0)) goto LAB_00155550;
    pCVar6 = &pCVar4->next;
  }
  uVar3 = 0;
  pCVar4 = pCVar2;
LAB_00155550:
  *ctp = pCVar4;
  return uVar3;
}

Assistant:

CTypeID lj_ctype_getname(CTState *cts, CType **ctp, GCstr *name, uint32_t tmask)
{
  CTypeID id = cts->hash[ct_hashname(name)];
  while (id) {
    CType *ct = ctype_get(cts, id);
    if (gcref(ct->name) == obj2gco(name) &&
	((tmask >> ctype_type(ct->info)) & 1)) {
      *ctp = ct;
      return id;
    }
    id = ct->next;
  }
  *ctp = &cts->tab[0];  /* Simplify caller logic. ctype_get() would assert. */
  return 0;
}